

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeAddOpList(Vdbe *p,int nOp,VdbeOpList *aOp)

{
  char cVar1;
  byte bVar2;
  Op *pOVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  iVar4 = p->nOp;
  if (p->nOpAlloc < iVar4 + nOp) {
    iVar4 = growOpArray(p);
    if (iVar4 != 0) {
      return 0;
    }
    iVar4 = p->nOp;
  }
  uVar5 = 0;
  if (0 < nOp) {
    uVar5 = (ulong)(uint)nOp;
  }
  lVar6 = (long)iVar4 * 0x18;
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    cVar1 = aOp[uVar7].p2;
    uVar8 = (uint)cVar1;
    pOVar3 = p->aOp;
    bVar2 = aOp[uVar7].opcode;
    (&pOVar3->opcode)[lVar6] = bVar2;
    *(int *)((long)&pOVar3->p1 + lVar6) = (int)aOp[uVar7].p1;
    if ((cVar1 < '\0') && ((""[bVar2] & 1) != 0)) {
      uVar8 = ~uVar8 + iVar4;
    }
    *(uint *)((long)&pOVar3->p2 + lVar6) = uVar8;
    *(int *)((long)&pOVar3->p3 + lVar6) = (int)aOp[uVar7].p3;
    (&pOVar3->p4type)[lVar6] = '\0';
    *(undefined8 *)((long)&pOVar3->p4 + lVar6) = 0;
    (&pOVar3->p5)[lVar6] = '\0';
    lVar6 = lVar6 + 0x18;
  }
  p->nOp = p->nOp + nOp;
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOpList(Vdbe *p, int nOp, VdbeOpList const *aOp){
  int addr;
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->nOp + nOp > p->nOpAlloc && growOpArray(p) ){
    return 0;
  }
  addr = p->nOp;
  if( ALWAYS(nOp>0) ){
    int i;
    VdbeOpList const *pIn = aOp;
    for(i=0; i<nOp; i++, pIn++){
      int p2 = pIn->p2;
      VdbeOp *pOut = &p->aOp[i+addr];
      pOut->opcode = pIn->opcode;
      pOut->p1 = pIn->p1;
      if( p2<0 && (sqlite3OpcodeProperty[pOut->opcode] & OPFLG_JUMP)!=0 ){
        pOut->p2 = addr + ADDR(p2);
      }else{
        pOut->p2 = p2;
      }
      pOut->p3 = pIn->p3;
      pOut->p4type = P4_NOTUSED;
      pOut->p4.p = 0;
      pOut->p5 = 0;
#ifdef SQLITE_DEBUG
      pOut->zComment = 0;
      if( p->db->flags & SQLITE_VdbeAddopTrace ){
        sqlite3VdbePrintOp(0, i+addr, &p->aOp[i+addr]);
      }
#endif
    }
    p->nOp += nOp;
  }
  return addr;
}